

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O1

SUNLinearSolver SUNLinSol_Band(N_Vector y,SUNMatrix A,SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  sunindextype sVar2;
  SUNLinearSolver p_Var3;
  sunindextype *psVar4;
  void *pvVar5;
  
  sVar2 = SUNBandMatrix_Rows(A);
  p_Var3 = (SUNLinearSolver)SUNLinSolNewEmpty(sunctx);
  p_Var1 = p_Var3->ops;
  p_Var1->gettype = SUNLinSolGetType_Band;
  p_Var1->getid = SUNLinSolGetID_Band;
  p_Var1->initialize = SUNLinSolInitialize_Band;
  p_Var1->setup = SUNLinSolSetup_Band;
  p_Var1->solve = SUNLinSolSolve_Band;
  p_Var1->lastflag = SUNLinSolLastFlag_Band;
  p_Var1->space = SUNLinSolSpace_Band;
  p_Var1->free = SUNLinSolFree_Band;
  psVar4 = (sunindextype *)malloc(0x18);
  p_Var3->content = psVar4;
  *psVar4 = sVar2;
  pvVar5 = malloc(sVar2 << 3);
  psVar4[1] = 0;
  psVar4[2] = 0;
  psVar4[1] = (sunindextype)pvVar5;
  return p_Var3;
}

Assistant:

SUNLinearSolver SUNLinSol_Band(SUNDIALS_MAYBE_UNUSED N_Vector y, SUNMatrix A,
                               SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_Band content;
  sunindextype MatrixRows;

  SUNAssertNull(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(SUNBandMatrix_Rows(A) == SUNBandMatrix_Columns(A),
                SUN_ERR_ARG_DIMSMISMATCH);
  SUNAssertNull(y->ops->nvgetarraypointer, SUN_ERR_ARG_INCOMPATIBLE);

  /* Check that A has appropriate storage upper bandwidth for factorization */
  MatrixRows = SUNBandMatrix_Rows(A);
  SUNAssertNull(SUNBandMatrix_StoredUpperBandwidth(A) >=
                  SUNMIN(MatrixRows - 1, SUNBandMatrix_LowerBandwidth(A) +
                                           SUNBandMatrix_UpperBandwidth(A)),
                SUN_ERR_ARG_INCOMPATIBLE);
  SUNAssertNull(MatrixRows == N_VGetLength(y), SUN_ERR_ARG_DIMSMISMATCH);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Band;
  S->ops->getid      = SUNLinSolGetID_Band;
  S->ops->initialize = SUNLinSolInitialize_Band;
  S->ops->setup      = SUNLinSolSetup_Band;
  S->ops->solve      = SUNLinSolSolve_Band;
  S->ops->lastflag   = SUNLinSolLastFlag_Band;
  S->ops->space      = SUNLinSolSpace_Band;
  S->ops->free       = SUNLinSolFree_Band;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Band)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype*)malloc(MatrixRows * sizeof(sunindextype));
  SUNAssertNull(content->pivots, SUN_ERR_MALLOC_FAIL);

  return (S);
}